

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O0

void __thiscall
soplex::SPxAutoPR<double>::load(SPxAutoPR<double> *this,SPxSolverBase<double> *p_solver)

{
  Type TVar1;
  SPxSolverBase<double> *in_RSI;
  SPxSolverBase<double> *in_RDI;
  SPxSteepPR<double> *unaff_retaddr;
  
  SPxSteepPR<double>::load(unaff_retaddr,in_RDI);
  SPxDevexPR<double>::load((SPxDevexPR<double> *)in_RSI,in_RDI);
  (in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
  super_ClassArray<soplex::Nonzero<double>_>.data = (Nonzero<double> *)in_RSI;
  TVar1 = SPxSolverBase<double>::type(in_RSI);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[7])(in_RDI,(ulong)(uint)TVar1);
  return;
}

Assistant:

void SPxAutoPR<R>::load(SPxSolverBase<R>* p_solver)
{
   steep.load(p_solver);
   devex.load(p_solver);
   this->thesolver = p_solver;
   setType(p_solver->type());
}